

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_icu::date_format<char>::date_format
          (date_format<char> *this,
          unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *fmt,
          string *codepage)

{
  pointer pcVar1;
  string local_40;
  
  (this->super_formatter<char>).super_base_formatter._vptr_base_formatter =
       (_func_int **)&PTR__date_format_001d20e8;
  pcVar1 = (codepage->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + codepage->_M_string_length);
  icu_std_converter<char,_1>::icu_std_converter(&this->cvt_,&local_40,cvt_skip);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->aicu_fmt_)._M_t.
  super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>._M_t.
  super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
  super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl =
       (fmt->_M_t).
       super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>._M_t.
       super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
       super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl;
  (fmt->_M_t).super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>.
  _M_t.super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
  super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl = (DateFormat *)0x0;
  this->icu_fmt_ =
       (this->aicu_fmt_)._M_t.
       super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>._M_t.
       super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
       super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl;
  return;
}

Assistant:

date_format(std::unique_ptr<icu::DateFormat> fmt,std::string codepage) :
                cvt_(codepage),
                aicu_fmt_(std::move(fmt))
            {
                icu_fmt_ = aicu_fmt_.get();
            }